

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators.h
# Opt level: O3

populator_set * __thiscall
spdlog::populators::
make_populator_set<std::unique_ptr<spdlog::populators::date_time_populator,std::default_delete<spdlog::populators::date_time_populator>>,std::unique_ptr<spdlog::populators::level_populator,std::default_delete<spdlog::populators::level_populator>>,std::unique_ptr<spdlog::populators::thread_id_populator,std::default_delete<spdlog::populators::thread_id_populator>>,std::unique_ptr<spdlog::populators::message_populator,std::default_delete<spdlog::populators::message_populator>>>
          (populator_set *__return_storage_ptr__,populators *this,
          unique_ptr<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
          *args,unique_ptr<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
                *args_1,
          unique_ptr<spdlog::populators::thread_id_populator,_std::default_delete<spdlog::populators::thread_id_populator>_>
          *args_2,unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
                  *args_3)

{
  long *plVar1;
  date_time_populator *pdVar2;
  level_populator *plVar3;
  thread_id_populator *ptVar4;
  __hashtable *__h;
  __node_gen_type __node_gen;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  plVar1 = *(long **)this;
  *(undefined8 *)this = 0;
  std::
  _Hashtable<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,false>>>>
            ();
  pdVar2 = (args->_M_t).
           super___uniq_ptr_impl<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
           ._M_t.
           super__Tuple_impl<0UL,_spdlog::populators::date_time_populator_*,_std::default_delete<spdlog::populators::date_time_populator>_>
           .super__Head_base<0UL,_spdlog::populators::date_time_populator_*,_false>._M_head_impl;
  (args->_M_t).
  super___uniq_ptr_impl<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
  ._M_t.
  super__Tuple_impl<0UL,_spdlog::populators::date_time_populator_*,_std::default_delete<spdlog::populators::date_time_populator>_>
  .super__Head_base<0UL,_spdlog::populators::date_time_populator_*,_false>._M_head_impl =
       (date_time_populator *)0x0;
  std::
  _Hashtable<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,false>>>>
            ((_Hashtable<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)__return_storage_ptr__);
  plVar3 = (args_1->_M_t).
           super___uniq_ptr_impl<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
           ._M_t.
           super__Tuple_impl<0UL,_spdlog::populators::level_populator_*,_std::default_delete<spdlog::populators::level_populator>_>
           .super__Head_base<0UL,_spdlog::populators::level_populator_*,_false>._M_head_impl;
  (args_1->_M_t).
  super___uniq_ptr_impl<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
  ._M_t.
  super__Tuple_impl<0UL,_spdlog::populators::level_populator_*,_std::default_delete<spdlog::populators::level_populator>_>
  .super__Head_base<0UL,_spdlog::populators::level_populator_*,_false>._M_head_impl =
       (level_populator *)0x0;
  std::
  _Hashtable<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,false>>>>
            ((_Hashtable<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)__return_storage_ptr__);
  ptVar4 = (args_2->_M_t).
           super___uniq_ptr_impl<spdlog::populators::thread_id_populator,_std::default_delete<spdlog::populators::thread_id_populator>_>
           ._M_t.
           super__Tuple_impl<0UL,_spdlog::populators::thread_id_populator_*,_std::default_delete<spdlog::populators::thread_id_populator>_>
           .super__Head_base<0UL,_spdlog::populators::thread_id_populator_*,_false>._M_head_impl;
  (args_2->_M_t).
  super___uniq_ptr_impl<spdlog::populators::thread_id_populator,_std::default_delete<spdlog::populators::thread_id_populator>_>
  ._M_t.
  super__Tuple_impl<0UL,_spdlog::populators::thread_id_populator_*,_std::default_delete<spdlog::populators::thread_id_populator>_>
  .super__Head_base<0UL,_spdlog::populators::thread_id_populator_*,_false>._M_head_impl =
       (thread_id_populator *)0x0;
  std::
  _Hashtable<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,false>>>>
            ((_Hashtable<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>,std::allocator<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::hash<std::unique_ptr<spdlog::populators::populator,std::default_delete<spdlog::populators::populator>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)__return_storage_ptr__);
  if (ptVar4 != (thread_id_populator *)0x0) {
    (*(ptVar4->super_populator)._vptr_populator[1])();
  }
  if (plVar3 != (level_populator *)0x0) {
    (**(code **)(*(long *)&(plVar3->super_pattern_populator).super_populator + 8))();
  }
  if (pdVar2 != (date_time_populator *)0x0) {
    (**(code **)(*(long *)&(pdVar2->super_pattern_populator).super_populator + 8))();
  }
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

populator_set make_populator_set(Args &&... args)
{
    populator_set ret;
    int dummy[] = {(ret.insert(std::move(std::forward<Args>(args))), 0)...};
    (void)dummy;
    return ret;
}